

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeLoad(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Expression *pEVar2;
  Load *this_00;
  
  if ((this->allowMemory == true) && ((type.id & 1) != 0 || type.id < 7)) {
    this_00 = (Load *)makeNonAtomicLoad(this,type);
    if (((type.id & 0xfffffffffffffffe) == 2) && (((byte)this->wasm[0x178] & 1) != 0)) {
      bVar1 = Random::oneIn(&this->random,2);
      if (!bVar1) {
        this_00 = Expression::cast<wasm::Load>((Expression *)this_00);
        *(undefined1 *)(**(long **)(this->wasm + 0x78) + 0x48) = 1;
        this_00->isAtomic = true;
        this_00->signed_ = false;
        (this_00->align).addr = (ulong)this_00->bytes;
      }
    }
    return (Expression *)this_00;
  }
  pEVar2 = makeTrivial(this,type);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeLoad(Type type) {
  // reference types cannot be stored in memory
  if (!allowMemory || type.isRef()) {
    return makeTrivial(type);
  }
  auto* ret = makeNonAtomicLoad(type);
  if (type != Type::i32 && type != Type::i64) {
    return ret;
  }
  if (!wasm.features.hasAtomics() || oneIn(2)) {
    return ret;
  }
  // make it atomic
  auto* load = ret->cast<Load>();
  wasm.memories[0]->shared = true;
  load->isAtomic = true;
  load->signed_ = false;
  load->align = load->bytes;
  return load;
}